

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O2

void duckdb_je_prof_cnt_all(prof_cnt_t *cnt_all)

{
  malloc_mutex_t *pmVar1;
  _Bool _Var2;
  _Bool even_if_attached;
  _Bool even_if_attached_00;
  prof_tdata_t *tdata;
  tsd_t *tsd;
  long *in_FS_OFFSET;
  
  tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  tdata = (prof_tdata_t *)0x0;
  duckdb_je_tsd_fetch_slow(tsd,false);
  malloc_mutex_lock((tsdn_t *)tsd,tdata->lock);
  if (tdata->attached == true) {
    _Var2 = prof_tdata_should_destroy((tsdn_t *)tdata,(prof_tdata_t *)0x1,even_if_attached);
    if (_Var2) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
      pmVar1 = tdata->lock;
      (pmVar1->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar1->field_0 + 0x48));
      prof_tdata_destroy(tsd,tdata,even_if_attached_00);
      return;
    }
    tdata->attached = false;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
  }
  pmVar1 = tdata->lock;
  (pmVar1->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar1->field_0 + 0x48));
  return;
}

Assistant:

void
prof_cnt_all(prof_cnt_t *cnt_all) {
	tsd_t *tsd = tsd_fetch();
	prof_tdata_t *tdata = prof_tdata_get(tsd, false);
	if (tdata == NULL) {
		memset(cnt_all, 0, sizeof(prof_cnt_t));
	} else {
		size_t leak_ngctx;
		prof_gctx_tree_t gctxs;
		prof_dump_prep(tsd, tdata, cnt_all, &leak_ngctx, &gctxs);
		prof_gctx_finish(tsd, &gctxs);
	}
}